

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi_baseline_index_impl.h
# Opt level: O0

void __thiscall
json::JEDIBaselineTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::
step_three(JEDIBaselineTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
           *this,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *mask_matrix,unsigned_long *matrix_size,
          vector<double,_std::allocator<double>_> *col_cover,int *step)

{
  unsigned_long uVar1;
  reference this_00;
  reference pvVar2;
  undefined1 auVar3 [16];
  undefined8 local_50;
  unsigned_long c_1;
  unsigned_long c;
  unsigned_long r;
  double col_count;
  int *step_local;
  vector<double,_std::allocator<double>_> *col_cover_local;
  unsigned_long *matrix_size_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *mask_matrix_local;
  JEDIBaselineTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
  *this_local;
  
  for (c = 0; c < *matrix_size; c = c + 1) {
    for (c_1 = 0; c_1 < *matrix_size; c_1 = c_1 + 1) {
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](mask_matrix,c);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,c_1);
      if ((*pvVar2 == 1.0) && (!NAN(*pvVar2))) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](col_cover,c_1);
        *pvVar2 = 1.0;
      }
    }
  }
  r = 0;
  for (local_50 = 0; local_50 < *matrix_size; local_50 = local_50 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](col_cover,local_50);
    if ((*pvVar2 == 1.0) && (!NAN(*pvVar2))) {
      r = (unsigned_long)((double)r + 1.0);
    }
  }
  uVar1 = *matrix_size;
  auVar3._8_4_ = (int)(uVar1 >> 0x20);
  auVar3._0_8_ = uVar1;
  auVar3._12_4_ = 0x45300000;
  if ((double)r <
      (auVar3._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) {
    *step = 4;
  }
  else {
    *step = 7;
  }
  return;
}

Assistant:

void JEDIBaselineTreeIndex<cost_matrixModel, TreeIndex>::step_three(
    std::vector<std::vector<double> >& mask_matrix,
    unsigned long& matrix_size,
    std::vector<double>& col_cover,
    int& step)
{
  double col_count = 0;
  for (unsigned long r = 0; r < matrix_size; r++)
  {
    for (unsigned long c = 0; c < matrix_size; c++)
    {
      if (mask_matrix[r][c] == 1)
      {
        col_cover[c] = 1;
      }
    }
  }

  col_count = 0;
  for (unsigned long c = 0; c < matrix_size; c++)
  {
    if (col_cover[c] == 1)
    {
        col_count += 1;
    }
  }
  if (col_count >= matrix_size)
  {
    step = 7;
  }
  else
  {
    step = 4;
  }
}